

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O2

bool GetOptionalBignum(FileTest *t,UniquePtr<BIGNUM> *out,string *key)

{
  bool bVar1;
  BIGNUM *__p;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  bVar1 = FileTest::HasAttribute(t,key);
  if (bVar1) {
    local_38._M_impl.super__Vector_impl_data._M_start = (uchar *)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
                               key);
    if (bVar1) {
      __p = BN_bin2bn(local_38._M_impl.super__Vector_impl_data._M_start,
                      (int)local_38._M_impl.super__Vector_impl_data._M_finish -
                      (int)local_38._M_impl.super__Vector_impl_data._M_start,(BIGNUM *)0x0);
      std::__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> *)out,(pointer)__p);
      bVar1 = (out->_M_t).super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl != (bignum_st *)0x0;
    }
    else {
      bVar1 = false;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  }
  else {
    std::__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> *)out,(pointer)0x0);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

static bool GetOptionalBignum(FileTest *t, bssl::UniquePtr<BIGNUM> *out,
                              const std::string &key) {
  if (!t->HasAttribute(key)) {
    *out = nullptr;
    return true;
  }

  std::vector<uint8_t> bytes;
  if (!t->GetBytes(&bytes, key)) {
    return false;
  }

  out->reset(BN_bin2bn(bytes.data(), bytes.size(), nullptr));
  return *out != nullptr;
}